

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O0

void Cnf_AddCardinConstrGeneral(sat_solver *p,Vec_Int_t *vVars,int K,int fStrict)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int nBits;
  int nVars;
  int Lit;
  int iVar;
  int iNext;
  int iCur;
  int k;
  int i;
  int fStrict_local;
  int K_local;
  Vec_Int_t *vVars_local;
  sat_solver *p_local;
  
  k = fStrict;
  i = K;
  _fStrict_local = vVars;
  vVars_local = (Vec_Int_t *)p;
  iVar2 = sat_solver_nvars(p);
  iVar3 = Vec_IntSize(_fStrict_local);
  for (iCur = 0; iVar5 = iCur, iVar4 = Vec_IntSize(_fStrict_local), iVar5 < iVar4; iCur = iCur + 1)
  {
    nVars = Vec_IntEntry(_fStrict_local,iCur);
    if ((nVars < 0) || (iVar2 <= nVars)) {
      __assert_fail("iVar >= 0 && iVar < nVars",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcFault.c"
                    ,0xad,"void Cnf_AddCardinConstrGeneral(sat_solver *, Vec_Int_t *, int, int)");
    }
  }
  sat_solver_setnvars((sat_solver *)vVars_local,iVar2 + iVar3 * iVar3);
  for (iCur = 0; pVVar1 = vVars_local, iCur < iVar3; iCur = iCur + 1) {
    iVar = iVar2 + iVar3 * (iCur + -1);
    iVar5 = iVar2 + iVar3 * iCur;
    Lit = iVar5;
    if ((iCur & 1U) != 0) {
      iVar4 = Cnf_AddCardinVar(iCur,iVar,_fStrict_local,0);
      sat_solver_add_buffer((sat_solver *)pVVar1,iVar5,iVar4,0);
    }
    for (iNext = iCur & 1; pVVar1 = vVars_local, iNext + 1 < iVar3; iNext = iNext + 2) {
      iVar5 = Lit + iNext;
      iVar4 = Cnf_AddCardinVar(iCur,iVar,_fStrict_local,iNext);
      iVar6 = Cnf_AddCardinVar(iCur,iVar,_fStrict_local,iNext + 1);
      sat_solver_add_and((sat_solver *)pVVar1,iVar5,iVar4,iVar6,1,1,1);
      pVVar1 = vVars_local;
      iVar5 = Lit + iNext;
      iVar4 = Cnf_AddCardinVar(iCur,iVar,_fStrict_local,iNext);
      iVar6 = Cnf_AddCardinVar(iCur,iVar,_fStrict_local,iNext + 1);
      sat_solver_add_and((sat_solver *)pVVar1,iVar5 + 1,iVar4,iVar6,0,0,0);
    }
    if (iNext == iVar3 + -1) {
      iVar5 = Lit + iVar3;
      iVar4 = Cnf_AddCardinVar(iCur,iVar,_fStrict_local,iVar3 + -1);
      sat_solver_add_buffer((sat_solver *)pVVar1,iVar5 + -1,iVar4,0);
    }
  }
  if ((0 < i) && (i < iVar3)) {
    nBits = Abc_Var2Lit(iVar2 + iVar3 * (iVar3 + -1) + i,1);
    iVar5 = sat_solver_addclause((sat_solver *)vVars_local,&nBits,&nVars);
    if (iVar5 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcFault.c"
                    ,0xc1,"void Cnf_AddCardinConstrGeneral(sat_solver *, Vec_Int_t *, int, int)");
    }
    if (k != 0) {
      nBits = Abc_Var2Lit(iVar2 + iVar3 * (iVar3 + -1) + i + -1,0);
      iVar2 = sat_solver_addclause((sat_solver *)vVars_local,&nBits,&nVars);
      if (iVar2 == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcFault.c"
                      ,0xc6,"void Cnf_AddCardinConstrGeneral(sat_solver *, Vec_Int_t *, int, int)");
      }
    }
    return;
  }
  __assert_fail("K > 0 && K < nBits",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcFault.c"
                ,0xbe,"void Cnf_AddCardinConstrGeneral(sat_solver *, Vec_Int_t *, int, int)");
}

Assistant:

void Cnf_AddCardinConstrGeneral( sat_solver * p, Vec_Int_t * vVars, int K, int fStrict )
{
    int i, k, iCur, iNext, iVar, Lit;
    int nVars = sat_solver_nvars(p);
    int nBits = Vec_IntSize(vVars);
    Vec_IntForEachEntry( vVars, iVar, i )
        assert( iVar >= 0 && iVar < nVars );
    sat_solver_setnvars( p, nVars + nBits * nBits );
    for ( i = 0; i < nBits; i++ )
    {
        iCur = nVars + nBits * (i-1);
        iNext = nVars + nBits * i;
        if ( i & 1 )
            sat_solver_add_buffer( p, iNext, Cnf_AddCardinVar(i, iCur, vVars, 0), 0 );
        for ( k = i & 1; k + 1 < nBits; k += 2 )
        {
            sat_solver_add_and( p, iNext+k  , Cnf_AddCardinVar(i, iCur, vVars, k), Cnf_AddCardinVar(i, iCur, vVars, k+1), 1, 1, 1 );
            sat_solver_add_and( p, iNext+k+1, Cnf_AddCardinVar(i, iCur, vVars, k), Cnf_AddCardinVar(i, iCur, vVars, k+1), 0, 0, 0 );
        }
        if ( k == nBits - 1 )
            sat_solver_add_buffer( p, iNext + nBits-1, Cnf_AddCardinVar(i, iCur, vVars, nBits-1), 0 );
    }
    // add final constraint
    assert( K > 0 && K < nBits );
    Lit = Abc_Var2Lit( nVars + nBits * (nBits - 1) + K, 1 );
    if ( !sat_solver_addclause( p, &Lit, &Lit+1 ) )
        assert( 0 );
    if ( fStrict )
    {
        Lit = Abc_Var2Lit( nVars + nBits * (nBits - 1) + K - 1, 0 );
        if ( !sat_solver_addclause( p, &Lit, &Lit+1 ) )
            assert( 0 );
    }
}